

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O1

result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t> *
__thiscall
toml::detail::repeat<toml::detail::character<(char)39>,toml::detail::exactly<3ul>>::
invoke<std::vector<char,std::allocator<char>>>
          (result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
           *__return_storage_ptr__,
          repeat<toml::detail::character<(char)39>,toml::detail::exactly<3ul>> *this,
          location<std::vector<char,_std::allocator<char>_>_> *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  const_iterator rollback;
  bool bVar4;
  element_type *peVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  size_type sVar7;
  value_type *other;
  location<std::vector<char,_std::allocator<char>_>_> *extraout_RDX;
  location<std::vector<char,_std::allocator<char>_>_> *extraout_RDX_00;
  location<std::vector<char,_std::allocator<char>_>_> *extraout_RDX_01;
  location<std::vector<char,_std::allocator<char>_>_> *extraout_RDX_02;
  location<std::vector<char,_std::allocator<char>_>_> *loc_00;
  long lVar8;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t> rslt
  ;
  region<std::vector<char,_std::allocator<char>_>_> retval;
  undefined1 local_c8 [80];
  region<std::vector<char,_std::allocator<char>_>_> local_78;
  
  region<std::vector<char,_std::allocator<char>_>_>::region
            (&local_78,(location<std::vector<char,_std::allocator<char>_>_> *)this);
  rollback._M_current = *(char **)(this + 0x40);
  lVar8 = 3;
  loc_00 = extraout_RDX;
  do {
    character<(char)39>::invoke<std::vector<char,std::allocator<char>>>
              ((result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                *)local_c8,(character<(char)39> *)this,loc_00);
    bVar4 = local_c8[0];
    if (local_c8[0] == false) {
      location<std::vector<char,_std::allocator<char>_>_>::reset
                ((location<std::vector<char,_std::allocator<char>_>_> *)this,rollback);
      __return_storage_ptr__->is_ok_ = false;
      loc_00 = extraout_RDX_01;
    }
    else {
      other = result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
              ::unwrap((result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                        *)local_c8);
      region<std::vector<char,_std::allocator<char>_>_>::operator+=(&local_78,other);
      loc_00 = extraout_RDX_00;
    }
    if (local_c8[0] == true) {
      region<std::vector<char,_std::allocator<char>_>_>::~region
                ((region<std::vector<char,_std::allocator<char>_>_> *)(local_c8 + 8));
      loc_00 = extraout_RDX_02;
    }
    sVar7 = local_78.source_name_._M_string_length;
    _Var6._M_pi = local_78.source_.
                  super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    peVar5 = local_78.source_.
             super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if (bVar4 == false) goto LAB_00139bca;
    lVar8 = lVar8 + -1;
  } while (lVar8 != 0);
  _Var2._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 0x28);
  local_c8._0_8_ = &PTR__region_00160ab8;
  paVar3 = &local_78.source_name_.field_2;
  local_78.source_.
  super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_78.source_.
  super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.source_name_._M_dataplus._M_p == paVar3) {
    local_c8._48_8_ = local_78.source_name_.field_2._8_8_;
    local_c8._24_8_ = _Var2._M_pi;
  }
  else {
    local_c8._24_8_ = local_78.source_name_._M_dataplus._M_p;
  }
  local_c8._41_7_ = local_78.source_name_.field_2._M_allocated_capacity._1_7_;
  local_c8[0x28] = local_78.source_name_.field_2._M_local_buf[0];
  local_78.source_name_._M_string_length = 0;
  local_78.source_name_.field_2._M_local_buf[0] = '\0';
  local_c8._56_8_ = local_78.first_._M_current;
  local_c8._64_8_ = local_78.last_._M_current;
  __return_storage_ptr__->is_ok_ = true;
  (__return_storage_ptr__->field_1).succ.value.super_region_base._vptr_region_base =
       (_func_int **)&PTR__region_00160ab8;
  (__return_storage_ptr__->field_1).succ.value.source_.
  super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar5;
  (__return_storage_ptr__->field_1).succ.value.source_.
  super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_c8._16_8_ = (element_type *)0x0;
  (__return_storage_ptr__->field_1).succ.value.source_.
  super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var6._M_pi;
  local_c8._8_8_ = (_func_int **)0x0;
  paVar1 = &(__return_storage_ptr__->field_1).succ.value.source_name_.field_2;
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)((long)&__return_storage_ptr__->field_1 + 0x18) = paVar1;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._24_8_ == _Var2._M_pi) {
    paVar1->_M_allocated_capacity = local_c8._40_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->field_1).succ.value.source_name_.field_2 + 8) =
         local_c8._48_8_;
  }
  else {
    (__return_storage_ptr__->field_1).succ.value.source_name_._M_dataplus._M_p =
         (pointer)local_c8._24_8_;
    (__return_storage_ptr__->field_1).succ.value.source_name_.field_2._M_allocated_capacity =
         local_c8._40_8_;
  }
  (__return_storage_ptr__->field_1).succ.value.source_name_._M_string_length = sVar7;
  local_c8._32_8_ = (pointer)0x0;
  local_c8._40_8_ = (ulong)(uint7)local_78.source_name_.field_2._M_allocated_capacity._1_7_ << 8;
  (__return_storage_ptr__->field_1).succ.value.first_._M_current = local_78.first_._M_current;
  (__return_storage_ptr__->field_1).succ.value.last_._M_current = local_78.last_._M_current;
  local_c8._24_8_ = _Var2._M_pi;
  local_78.source_name_._M_dataplus._M_p = (pointer)paVar3;
  region<std::vector<char,_std::allocator<char>_>_>::~region
            ((region<std::vector<char,_std::allocator<char>_>_> *)local_c8);
LAB_00139bca:
  region<std::vector<char,_std::allocator<char>_>_>::~region(&local_78);
  return __return_storage_ptr__;
}

Assistant:

static result<region<Cont>, none_t>
    invoke(location<Cont>& loc)
    {
        region<Cont> retval(loc);
        const auto first = loc.iter();
        for(std::size_t i=0; i<N; ++i)
        {
            auto rslt = T::invoke(loc);
            if(rslt.is_err())
            {
                loc.reset(first);
                return none();
            }
            retval += rslt.unwrap();
        }
        return ok(std::move(retval));
    }